

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool google::protobuf::internal::cpp::IsStringFieldWithPrivatizedAccessors(FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  CppFeatures_StringType CVar3;
  Type TVar4;
  FeatureSet *this;
  ConstType this_00;
  FieldDescriptor *field_local;
  
  CVar2 = FieldDescriptor::cpp_type(field);
  if (CVar2 == CPPTYPE_STRING) {
    this = InternalFeatureHelper::GetFeatures<google::protobuf::FieldDescriptor>(field);
    this_00 = FeatureSet::
              GetExtension<google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false,_0>
                        (this,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false>
                               *)pb::cpp);
    CVar3 = pb::CppFeatures::string_type(this_00);
    if ((CVar3 == CppFeatures_StringType_CORD) &&
       (((TVar4 = FieldDescriptor::type(field), TVar4 != TYPE_BYTES ||
         (bVar1 = FieldDescriptor::is_repeated(field), bVar1)) ||
        (bVar1 = FieldDescriptor::is_extension(field), bVar1)))) {
      return true;
    }
  }
  return false;
}

Assistant:

bool IsStringFieldWithPrivatizedAccessors(const FieldDescriptor& field) {
  // In open-source, protobuf CORD is only supported for singular bytes
  // fields.
  if (field.cpp_type() == FieldDescriptor::CPPTYPE_STRING &&
      InternalFeatureHelper::GetFeatures(field)
              .GetExtension(pb::cpp)
              .string_type() == pb::CppFeatures::CORD &&
      (field.type() != FieldDescriptor::TYPE_BYTES || field.is_repeated() ||
       field.is_extension())
  ) {
    return true;
  }

  return false;
}